

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O3

void __thiscall HighsLogOptions::clear(HighsLogOptions *this)

{
  _Manager_type p_Var1;
  
  this->user_log_callback = (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
  this->user_log_callback_data = (void *)0x0;
  this->log_to_console = (bool *)0x0;
  this->log_dev_level = (HighsInt *)0x0;
  this->log_stream = (FILE *)0x0;
  this->output_flag = (bool *)0x0;
  p_Var1 = (this->user_callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->user_callback,(_Any_data *)&this->user_callback,__destroy_functor)
    ;
    (this->user_callback).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->user_callback)._M_invoker = (_Invoker_type)0x0;
  }
  this->user_callback_data = (void *)0x0;
  this->user_callback_active = false;
  return;
}

Assistant:

void HighsLogOptions::clear() {
  this->log_stream = nullptr;
  this->output_flag = nullptr;
  this->log_to_console = nullptr;
  this->log_dev_level = nullptr;
  this->user_log_callback = nullptr;
  this->user_log_callback_data = nullptr;
  this->user_callback = nullptr;
  this->user_callback_data = nullptr;
  this->user_callback_active = false;
}